

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

void read_level(level_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  level_t *__dest;
  ulong uVar4;
  double dVar5;
  
  uVar2 = 0;
  record->id[0] = '\0';
  record->name[0] = '\0';
  record->index = 0.0;
  uVar4 = (ulong)(uint)field_count;
  if (field_count < 1) {
    uVar4 = uVar2;
  }
  do {
    if (uVar4 == uVar2) {
      return;
    }
    pcVar3 = field_names[uVar2];
    iVar1 = strcmp(pcVar3,"level_id");
    if (iVar1 == 0) {
      pcVar3 = field_values[uVar2];
      __dest = record;
LAB_0010542b:
      strcpy(__dest->id,pcVar3);
    }
    else {
      iVar1 = strcmp(pcVar3,"level_index");
      if (iVar1 == 0) {
        dVar5 = strtod(field_values[uVar2],(char **)0x0);
        record->index = dVar5;
      }
      else {
        iVar1 = strcmp(pcVar3,"level_name");
        if (iVar1 == 0) {
          pcVar3 = field_values[uVar2];
          __dest = (level_t *)record->name;
          goto LAB_0010542b;
        }
      }
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void read_level(level_t *record, int field_count, const char **field_names, const char **field_values) {
    init_level(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "level_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "level_index") == 0) {
            record->index = strtod(field_values[i], NULL);
            continue;
        }
        if (strcmp(field_names[i], "level_name") == 0) {
            strcpy(record->name, field_values[i]);
            continue;
        }
    }
}